

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O1

void __thiscall HostVector_value_constructor_Test::TestBody(HostVector_value_constructor_Test *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  void *__ptr;
  char *pcVar4;
  void *ptr;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  internal local_40;
  undefined7 uStack_3f;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  iVar2 = posix_memalign((void **)&local_40,8,0x28);
  lVar3 = 0;
  __ptr = (void *)0x0;
  if (iVar2 == 0) {
    __ptr = (void *)CONCAT71(uStack_3f,local_40);
  }
  do {
    *(undefined4 *)((long)__ptr + lVar3) = 0xfffffffb;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x28);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000a;
  local_48.data_._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (&local_40,"v1.size()","10",(unsigned_long *)&local_50,(int *)&local_48);
  if (local_40 == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
               ,0x75,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar3 = 0;
  do {
    local_50.ptr_._0_4_ = 0xfffffffb;
    testing::internal::CmpHelperEQ<int,int>
              (&local_40,"v1[i]","-5",(int *)((long)__ptr + lVar3),(int *)&local_50);
    if (local_40 == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar4 = "";
      if (local_38.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                 ,0x77,pcVar4);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_50.ptr_ + 8))();
        }
        local_50.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x28);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

TEST(HostVector, value_constructor) {
    using namespace memory;

    HostVector<int> v1(10, -5);

    EXPECT_EQ(v1.size(), 10);
    for(auto i : v1.range()) {
        EXPECT_EQ(v1[i], -5);
    }
}